

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::applyDiagnosticPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  SourceManager *pSVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  bool bVar2;
  size_type delta;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *this_00;
  SyntaxNode *pSVar3;
  Diagnostic *this_01;
  NameValuePragmaExpressionSyntax *pNVar4;
  PragmaExpressionSyntax *pPVar5;
  ParenPragmaExpressionSyntax *pPVar6;
  SourceRange SVar7;
  PragmaExpressionSyntax *value;
  iterator __end6;
  iterator __begin6;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range6;
  ParenPragmaExpressionSyntax *paren;
  anon_class_16_2_8b023938 setDirective;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1d0;
  size_t local_1c0;
  char *local_1b8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1b0;
  size_t local_1a0;
  char *local_198;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_190;
  size_t local_180;
  char *local_178;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_170;
  size_t local_160;
  char *local_158;
  undefined1 local_150 [8];
  string_view text;
  DiagnosticSeverity severity;
  NameValuePragmaExpressionSyntax *nvp;
  string_view local_108;
  SourceLocation local_f8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_f0;
  size_t local_e0;
  char *local_d8;
  string_view local_d0;
  SourceLocation local_c0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b8;
  size_t local_a8;
  char *local_a0;
  undefined1 local_98 [8];
  string_view action;
  SimplePragmaExpressionSyntax *simple;
  PragmaExpressionSyntax *arg;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  SourceLocation local_40;
  SourceLocation local_38;
  DiagCode local_2c;
  undefined1 local_28 [8];
  Token last;
  PragmaDirectiveSyntax *pragma_local;
  Preprocessor *this_local;
  
  last.info = (Info *)pragma;
  bVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::empty
                    (&pragma->args);
  if (bVar2) {
    _local_28 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)last.info);
    local_2c.subsystem = Preprocessor;
    local_2c.code = 0x1d;
    local_40 = Token::location((Token *)local_28);
    ___range2 = Token::rawText((Token *)local_28);
    delta = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&__range2);
    local_38 = SourceLocation::operator+(&local_40,delta);
    addDiag(this,local_2c,local_38);
  }
  else {
    this_00 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)(last.info + 3);
    join_0x00000010_0x00000000_ =
         slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::begin(this_00);
    _arg = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::end(this_00);
    while (bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                   ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                                 *)&__end2.index,
                                (iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)&arg
                               ), bVar2) {
      pSVar3 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::operator*
                          ((iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)
                           &__end2.index)->super_SyntaxNode;
      if (pSVar3->kind == SimplePragmaExpression) {
        action._M_str =
             (char *)slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                               (pSVar3);
        _local_98 = Token::rawText(&((SimplePragmaExpressionSyntax *)action._M_str)->value);
        if (*(short *)(action._M_str + 0x10) == 2) {
          local_a8 = (size_t)local_98;
          local_a0 = (char *)action._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"push")
          ;
          __x_04._M_str = local_a0;
          __x_04._M_len = local_a8;
          bVar2 = std::operator==(__x_04,local_b8);
          if (bVar2) {
            pSVar1 = this->sourceManager;
            local_c0 = Token::location((Token *)(action._M_str + 0x10));
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_d0,"__push__");
            SourceManager::addDiagnosticDirective(pSVar1,local_c0,local_d0,Ignored);
            goto LAB_00251b07;
          }
        }
        if (*(short *)(action._M_str + 0x10) == 2) {
          local_e0 = (size_t)local_98;
          local_d8 = (char *)action._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f0,"pop");
          __x_03._M_str = local_d8;
          __x_03._M_len = local_e0;
          bVar2 = std::operator==(__x_03,local_f0);
          if (bVar2) {
            pSVar1 = this->sourceManager;
            local_f8 = Token::location((Token *)(action._M_str + 0x10));
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_108,"__pop__");
            SourceManager::addDiagnosticDirective(pSVar1,local_f8,local_108,Ignored);
            goto LAB_00251b07;
          }
        }
        SVar7 = Token::range((Token *)(action._M_str + 0x10));
        this_01 = addDiag(this,(DiagCode)0x2a0004,SVar7);
        Diagnostic::operator<<(this_01,_local_98);
      }
      else if (pSVar3->kind == NameValuePragmaExpression) {
        pNVar4 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                           (pSVar3);
        _local_150 = Token::valueText(&pNVar4->name);
        local_160 = (size_t)local_150;
        local_158 = (char *)text._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_170,"ignore");
        __x_02._M_str = local_158;
        __x_02._M_len = local_160;
        bVar2 = std::operator==(__x_02,local_170);
        if (bVar2) {
          text._M_str._4_4_ = 0;
        }
        else {
          local_180 = (size_t)local_150;
          local_178 = (char *)text._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_190,"warn");
          __x_01._M_str = local_178;
          __x_01._M_len = local_180;
          bVar2 = std::operator==(__x_01,local_190);
          if (bVar2) {
            text._M_str._4_4_ = 2;
          }
          else {
            local_1a0 = (size_t)local_150;
            local_198 = (char *)text._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_1b0,"error");
            __x_00._M_str = local_198;
            __x_00._M_len = local_1a0;
            bVar2 = std::operator==(__x_00,local_1b0);
            if (bVar2) {
              text._M_str._4_4_ = 3;
            }
            else {
              local_1c0 = (size_t)local_150;
              local_1b8 = (char *)text._M_len;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_1d0,"fatal");
              __x._M_str = local_1b8;
              __x._M_len = local_1c0;
              bVar2 = std::operator==(__x,local_1d0);
              if (!bVar2) {
                join_0x00000010_0x00000000_ = Token::range(&pNVar4->name);
                addDiag(this,(DiagCode)0x1e0004,join_0x00000010_0x00000000_);
                goto LAB_00251b07;
              }
              text._M_str._4_4_ = 4;
            }
          }
        }
        setDirective.this = (Preprocessor *)((long)&text._M_str + 4);
        paren = (ParenPragmaExpressionSyntax *)this;
        pPVar5 = not_null<slang::syntax::PragmaExpressionSyntax_*>::operator->(&pNVar4->value);
        if ((pPVar5->super_SyntaxNode).kind == ParenPragmaExpression) {
          pSVar3 = &not_null<slang::syntax::PragmaExpressionSyntax_*>::operator->(&pNVar4->value)->
                    super_SyntaxNode;
          pPVar6 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>(pSVar3)
          ;
          join_0x00000010_0x00000000_ =
               slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::begin
                         (&pPVar6->values);
          _value = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::end
                             (&pPVar6->values);
          while (bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_slang::syntax::PragmaExpressionSyntax_**,_slang::syntax::PragmaExpressionSyntax_*&>
                         ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_slang::syntax::PragmaExpressionSyntax_**,_slang::syntax::PragmaExpressionSyntax_*&>
                                       *)&__end6.index,
                                      (iterator_base<slang::syntax::PragmaExpressionSyntax_*> *)
                                      &value), bVar2) {
            pPVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                     iterator_base<slang::syntax::PragmaExpressionSyntax_*>::operator*
                               ((iterator_base<slang::syntax::PragmaExpressionSyntax_*> *)
                                &__end6.index);
            applyDiagnosticPragma::anon_class_16_2_8b023938::operator()
                      ((anon_class_16_2_8b023938 *)&paren,pPVar5);
            iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_slang::syntax::PragmaExpressionSyntax_**,_slang::syntax::PragmaExpressionSyntax_*&>
            ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_slang::syntax::PragmaExpressionSyntax_**,_slang::syntax::PragmaExpressionSyntax_*&>
                          *)&__end6.index);
          }
        }
        else {
          pPVar5 = not_null<slang::syntax::PragmaExpressionSyntax_*>::operator*(&pNVar4->value);
          applyDiagnosticPragma::anon_class_16_2_8b023938::operator()
                    ((anon_class_16_2_8b023938 *)&paren,pPVar5);
        }
      }
      else {
        SVar7 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
        addDiag(this,(DiagCode)0x1d0004,SVar7);
      }
LAB_00251b07:
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
      ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                    *)&__end2.index);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyDiagnosticPragma(const PragmaDirectiveSyntax& pragma) {
    if (pragma.args.empty()) {
        Token last = pragma.getLastToken();
        addDiag(diag::ExpectedDiagPragmaArg, last.location() + last.rawText().length());
        return;
    }

    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            string_view action = simple.value.rawText();
            if (simple.value.kind == TokenKind::Identifier && action == "push") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__push__",
                                                     DiagnosticSeverity::Ignored);
            }
            else if (simple.value.kind == TokenKind::Identifier && action == "pop") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__pop__",
                                                     DiagnosticSeverity::Ignored);
            }
            else {
                addDiag(diag::UnknownDiagPragmaArg, simple.value.range()) << action;
            }
        }
        else if (arg->kind == SyntaxKind::NameValuePragmaExpression) {
            auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();

            DiagnosticSeverity severity;
            string_view text = nvp.name.valueText();
            if (text == "ignore")
                severity = DiagnosticSeverity::Ignored;
            else if (text == "warn")
                severity = DiagnosticSeverity::Warning;
            else if (text == "error")
                severity = DiagnosticSeverity::Error;
            else if (text == "fatal")
                severity = DiagnosticSeverity::Fatal;
            else {
                addDiag(diag::ExpectedDiagPragmaLevel, nvp.name.range());
                continue;
            }

            auto setDirective = [&](const PragmaExpressionSyntax& expr) {
                if (expr.kind == SyntaxKind::SimplePragmaExpression) {
                    auto& simple = expr.as<SimplePragmaExpressionSyntax>();
                    if (simple.value.kind == TokenKind::StringLiteral) {
                        sourceManager.addDiagnosticDirective(simple.value.location(),
                                                             simple.value.valueText(), severity);
                    }
                    else {
                        addDiag(diag::ExpectedDiagPragmaArg, simple.value.range());
                    }
                }
                else {
                    addDiag(diag::ExpectedDiagPragmaArg, expr.sourceRange());
                }
            };

            if (nvp.value->kind == SyntaxKind::ParenPragmaExpression) {
                auto& paren = nvp.value->as<ParenPragmaExpressionSyntax>();
                for (auto value : paren.values)
                    setDirective(*value);
            }
            else {
                setDirective(*nvp.value);
            }
        }
        else {
            addDiag(diag::ExpectedDiagPragmaArg, arg->sourceRange());
        }
    }
}